

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
iterate(TestStatus *__return_storage_ptr__,
       DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  int iVar1;
  DeviceInterface *pDVar2;
  VkCommandBuffer_s *pVVar3;
  deUint64 dVar4;
  VkOffset3D offset;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  qpTestResult code;
  VkDevice pVVar5;
  VkDevice pVVar6;
  bool bVar7;
  uint uVar8;
  VkResult VVar9;
  TestContext *this_00;
  VkQueue queue_00;
  MovePtr *this_01;
  Buffer *this_02;
  VkCommandBuffer_s **ppVVar10;
  Handle<(vk::HandleType)18> *pHVar11;
  size_type sVar12;
  Handle<(vk::HandleType)8> *pHVar13;
  Allocation *pAVar14;
  VkDeviceMemory VVar15;
  VkDeviceSize VVar16;
  void *dst;
  reference src;
  reference puVar17;
  reference pvVar18;
  Image *this_03;
  Allocator *allocator_00;
  char *__s;
  Move<vk::VkCommandBuffer_s_*> *this_04;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  allocator<char> local_361;
  string local_360;
  ConstPixelBufferAccess local_340;
  qpTestResult local_314;
  void *pvStack_310;
  qpTestResult res;
  deInt32 local_308;
  undefined1 local_300 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  iterator iStack_298;
  deUint32 idx;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_290;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_288;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_280;
  const_iterator it;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  PixelBufferAccess local_238;
  TextureFormat local_210;
  undefined1 local_208 [8];
  TextureLevel refImage;
  undefined8 uStack_1d8;
  VkSubmitInfo submitInfo;
  VkMemoryRequirements local_158;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_140;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_130;
  undefined1 local_120 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indexAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> local_100;
  RefData<vk::Handle<(vk::HandleType)8>_> local_e0;
  undefined1 local_c0 [8];
  VkBufferCreateInfo bufferCreateInfo;
  Move<vk::Handle<(vk::HandleType)8>_> indexBuffer;
  deUint32 bufferSize;
  deUint64 local_58;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Allocator *allocator;
  VkQueue queue;
  VkDevice pVStack_30;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  TestLog *log;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this_local;
  
  log = (TestLog *)this;
  this_local = (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *)
               __return_storage_ptr__;
  this_00 = Context::getTestContext((this->super_DrawTestInstanceBase).super_TestInstance.m_context)
  ;
  vk = (DeviceInterface *)tcu::TestContext::getLog(this_00);
  vkDevice = (VkDevice)
             Context::getDeviceInterface
                       ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  pVStack_30 = Context::getDevice((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue._4_4_ = Context::getUniversalQueueFamilyIndex
                          ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  this_01 = (MovePtr *)
            Context::getDefaultAllocator
                      ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  vertexBuffer.m_internal = 0;
  this_02 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestInstanceBase).m_vertexBuffer);
  local_58 = (deUint64)Draw::Buffer::object(this_02);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  this_04 = &(this->super_DrawTestInstanceBase).m_cmdBuffer;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar10;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_DrawTestInstanceBase).m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,pHVar11->m_internal);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x58])(pDVar2,*ppVVar10,0,1,&local_58,&vertexBuffer);
  sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     (&(this->m_data).super_IndexedParamsBase.indexes);
  uVar8 = (int)sVar12 << 2;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferCreateInfo.pQueueFamilyIndices);
  local_c0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext._0_4_ = 0;
  bufferCreateInfo._16_8_ = ZEXT48(uVar8);
  bufferCreateInfo.size._0_4_ = 0x40;
  bufferCreateInfo.size._4_4_ = 0;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo._40_8_ = (long)&queue + 4;
  ::vk::createBuffer(&local_100,(DeviceInterface *)vkDevice,pVStack_30,
                     (VkBufferCreateInfo *)local_c0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  uVar19 = (undefined4)local_e0.object.m_internal;
  uVar20 = (undefined4)(local_e0.object.m_internal >> 0x20);
  uVar21 = SUB84(local_e0.deleter.m_deviceIface,0);
  uVar22 = (undefined4)((ulong)local_e0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_deviceIface._0_4_ = uVar21;
  data_00.object.m_internal = local_e0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = uVar22;
  data_00.deleter.m_device._0_4_ = (int)local_e0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e0.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_e0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferCreateInfo.pQueueFamilyIndices,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_100);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_30;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferCreateInfo.pQueueFamilyIndices);
  ::vk::getBufferMemoryRequirements
            (&local_158,(DeviceInterface *)pVVar6,pVVar5,(VkBuffer)pHVar13->m_internal);
  (*(*(_func_int ***)this_01)[3])
            (&local_140,this_01,&local_158,(ulong)::vk::MemoryRequirement::HostVisible);
  local_130 = de::details::MovePtr::operator_cast_to_PtrData(&local_140,this_01);
  data.ptr._4_4_ = uVar20;
  data.ptr._0_4_ = uVar19;
  data._8_4_ = uVar21;
  data._12_4_ = uVar22;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_140);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_30;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferCreateInfo.pQueueFamilyIndices);
  dVar4 = pHVar13->m_internal;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  VVar9 = (**(code **)(*(long *)pVVar6 + 0x60))(pVVar6,pVVar5,dVar4,VVar15.m_internal,VVar16);
  ::vk::checkResult(VVar9,
                    "vk.bindBufferMemory(vkDevice, *indexBuffer, indexAlloc->getMemory(), indexAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x308);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120)
  ;
  dst = ::vk::Allocation::getHostPtr(pAVar14);
  src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&(this->m_data).super_IndexedParamsBase.indexes,0);
  ::deMemcpy(dst,src,(ulong)uVar8);
  pVVar5 = pVStack_30;
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange(pDVar2,pVVar5,VVar15,VVar16,(ulong)uVar8);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar10;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferCreateInfo.pQueueFamilyIndices);
  (*pDVar2->_vptr_DeviceInterface[0x57])
            (pDVar2,pVVar3,pHVar13->m_internal,0,
             (ulong)(this->m_data).super_IndexedParamsBase.indexType);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x5a])
            (pDVar2,*ppVVar10,(ulong)*(uint *)&(this->m_data).super_IndexedParamsBase.field_0x1c,
             (ulong)*(uint *)&(this->m_data).field_0x40,(ulong)*(uint *)&(this->m_data).field_0x44,
             (ulong)*(uint *)&(this->m_data).field_0x48,*(undefined4 *)&(this->m_data).field_0x4c);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,*ppVVar10);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar10);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_1d8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                   super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle((Handle<(vk::HandleType)6> *)&refImage.m_data.m_cap,0);
  VVar9 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,queue_00,1,&uStack_1d8,refImage.m_data.m_cap);
  ::vk::checkResult(VVar9,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,799);
  local_210 = ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_208,&local_210,0x100,0x100,1);
  tcu::TextureLevel::getAccess(&local_238,(TextureLevel *)local_208);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &vertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0.0,0.0,0.0,1.0);
  tcu::clear(&local_238,
             (Vec4 *)&vertices.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&it);
  local_290._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&(this->m_data).super_IndexedParamsBase.indexes);
  local_288 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator+(&local_290,(ulong)*(uint *)&(this->m_data).field_0x44);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_280,&local_288);
  while( true ) {
    iStack_298 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&(this->m_data).super_IndexedParamsBase.indexes);
    bVar7 = __gnu_cxx::operator!=(&local_280,&stack0xfffffffffffffd68);
    if (!bVar7) break;
    iVar1 = *(int *)&(this->m_data).field_0x48;
    puVar17 = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_280);
    uVar8 = iVar1 + *puVar17;
    pvVar18 = std::
              vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
              ::operator[]((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                            *)&this->m_data,(ulong)uVar8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar18->position);
    pvVar18 = std::
              vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
              ::operator[]((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                            *)&this->m_data,(ulong)uVar8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&it,
               &pvVar18->color);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_280);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&zeroOffset.z,(TextureLevel *)local_208);
  DrawTestInstanceBase::generateRefImage
            (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&zeroOffset.z,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&it);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  VVar9 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,queue_00);
  ::vk::checkResult(VVar9,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x330);
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_03 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestInstanceBase).m_colorTargetImage);
  allocator_00 = Context::getDefaultAllocator
                           ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  local_308 = zeroOffset.x;
  pvStack_310 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_300,this_03,queue_00,allocator_00,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  pDVar2 = vk;
  local_314 = QP_TEST_RESULT_PASS;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_340,(TextureLevel *)local_208);
  bVar7 = imageCompare((TestLog *)pDVar2,&local_340,(ConstPixelBufferAccess *)local_300,
                       (this->m_data).super_DrawParamsBase.topology);
  if (((bVar7 ^ 0xffU) & 1) != 0) {
    local_314 = QP_TEST_RESULT_FAIL;
  }
  code = local_314;
  __s = qpGetTestResultName(local_314);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,__s,&local_361);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&it);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_208);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_120);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferCreateInfo.pQueueFamilyIndices);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawIndexedParams>::iterate (void)
{
	tcu::TestLog				&log				= m_context.getTestContext().getLog();
	const vk::DeviceInterface&	vk					= m_context.getDeviceInterface();
	const vk::VkDevice			vkDevice			= m_context.getDevice();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const vk::VkQueue			queue				= m_context.getUniversalQueue();
	vk::Allocator&				allocator			= m_context.getDefaultAllocator();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset = 0;
	const vk::VkBuffer	vertexBuffer = m_vertexBuffer->object();

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const deUint32	bufferSize	= (deUint32)(m_data.indexes.size() * sizeof(deUint32));

	vk::Move<vk::VkBuffer>	indexBuffer;

	const vk::VkBufferCreateInfo	bufferCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT,		// VkBufferUsageFlags	usage;
		vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyIndexCount;
		&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
	};

	indexBuffer = createBuffer(vk, vkDevice, &bufferCreateInfo);

	de::MovePtr<vk::Allocation>	indexAlloc;

	indexAlloc = allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indexBuffer), vk::MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *indexBuffer, indexAlloc->getMemory(), indexAlloc->getOffset()));

	deMemcpy(indexAlloc->getHostPtr(), &(m_data.indexes[0]), bufferSize);

	vk::flushMappedMemoryRange(m_vk, vkDevice, indexAlloc->getMemory(), indexAlloc->getOffset(), bufferSize);

	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, *indexBuffer, 0u, m_data.indexType);
	m_vk.cmdDrawIndexed(*m_cmdBuffer, m_data.params.indexCount, m_data.params.instanceCount, m_data.params.firstIndex, m_data.params.vertexOffset, m_data.params.firstInstance);
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel	refImage	(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	std::vector<tcu::Vec4>	vertices;
	std::vector<tcu::Vec4>	colors;

	for (std::vector<deUint32>::const_iterator it = m_data.indexes.begin() + m_data.params.firstIndex; it != m_data.indexes.end(); ++it)
	{
		deUint32 idx = m_data.params.vertexOffset + *it;
		vertices.push_back(m_data.vertices[idx].position);
		colors.push_back(m_data.vertices[idx].color);
	}
	generateRefImage(refImage.getAccess(), vertices, colors);

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}